

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void UpdateWindowInFocusOrderList(ImGuiWindow *window,bool just_created,ImGuiWindowFlags new_flags)

{
  short *psVar1;
  int *piVar2;
  int iVar3;
  ImGuiWindow **ppIVar4;
  ImGuiContext *pIVar5;
  ImGuiWindow **__dest;
  int iVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  int iVar11;
  ImGuiContext *ctx;
  
  pIVar5 = GImGui;
  uVar8 = new_flags & 0x1000000;
  bVar10 = SUB41(uVar8 >> 0x18,0);
  if ((~just_created & uVar8 >> 0x18 == (uint)window->IsExplicitChild) == 0 && bVar10 == false) {
    iVar11 = (GImGui->WindowsFocusOrder).Size;
    iVar3 = (GImGui->WindowsFocusOrder).Capacity;
    if (iVar11 == iVar3) {
      iVar11 = iVar11 + 1;
      if (iVar3 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar3 / 2 + iVar3;
      }
      if (iVar11 < iVar6) {
        iVar11 = iVar6;
      }
      if (iVar3 < iVar11) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar2 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar2 = *piVar2 + 1;
        }
        __dest = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar11 << 3,GImAllocatorUserData);
        ppIVar4 = (pIVar5->WindowsFocusOrder).Data;
        if (ppIVar4 != (ImGuiWindow **)0x0) {
          memcpy(__dest,ppIVar4,(long)(pIVar5->WindowsFocusOrder).Size << 3);
          ppIVar4 = (pIVar5->WindowsFocusOrder).Data;
          if ((ppIVar4 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar2 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar2 = *piVar2 + -1;
          }
          (*GImAllocatorFreeFunc)(ppIVar4,GImAllocatorUserData);
        }
        (pIVar5->WindowsFocusOrder).Data = __dest;
        (pIVar5->WindowsFocusOrder).Capacity = iVar11;
      }
    }
    (pIVar5->WindowsFocusOrder).Data[(pIVar5->WindowsFocusOrder).Size] = window;
    iVar11 = (pIVar5->WindowsFocusOrder).Size;
    (pIVar5->WindowsFocusOrder).Size = iVar11 + 1;
    window->FocusOrder = (short)iVar11;
  }
  else if ((uVar8 != 0 && !just_created) && uVar8 >> 0x18 != (uint)window->IsExplicitChild) {
    iVar11 = (GImGui->WindowsFocusOrder).Size;
    if (window->FocusOrder + 1 < iVar11) {
      ppIVar4 = (GImGui->WindowsFocusOrder).Data;
      lVar7 = (long)(int)window->FocusOrder + 1;
      do {
        psVar1 = &ppIVar4[lVar7]->FocusOrder;
        *psVar1 = *psVar1 + -1;
        lVar7 = lVar7 + 1;
      } while (iVar11 != lVar7);
    }
    ppIVar4 = (pIVar5->WindowsFocusOrder).Data;
    uVar9 = (ulong)window->FocusOrder;
    memmove(ppIVar4 + uVar9,ppIVar4 + uVar9 + 1,(~uVar9 + (long)iVar11) * 8);
    (pIVar5->WindowsFocusOrder).Size = (pIVar5->WindowsFocusOrder).Size + -1;
    window->FocusOrder = -1;
  }
  window->IsExplicitChild = bVar10;
  return;
}

Assistant:

static void UpdateWindowInFocusOrderList(ImGuiWindow* window, bool just_created, ImGuiWindowFlags new_flags)
{
    ImGuiContext& g = *GImGui;

    const bool new_is_explicit_child = (new_flags & ImGuiWindowFlags_ChildWindow) != 0;
    const bool child_flag_changed = new_is_explicit_child != window->IsExplicitChild;
    if ((just_created || child_flag_changed) && !new_is_explicit_child)
    {
        IM_ASSERT(!g.WindowsFocusOrder.contains(window));
        g.WindowsFocusOrder.push_back(window);
        window->FocusOrder = (short)(g.WindowsFocusOrder.Size - 1);
    }
    else if (!just_created && child_flag_changed && new_is_explicit_child)
    {
        IM_ASSERT(g.WindowsFocusOrder[window->FocusOrder] == window);
        for (int n = window->FocusOrder + 1; n < g.WindowsFocusOrder.Size; n++)
            g.WindowsFocusOrder[n]->FocusOrder--;
        g.WindowsFocusOrder.erase(g.WindowsFocusOrder.Data + window->FocusOrder);
        window->FocusOrder = -1;
    }
    window->IsExplicitChild = new_is_explicit_child;
}